

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button_widgets.cpp
# Opt level: O0

void Am_Choice_List_Interim_Do_proc(Am_Object *inter)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *pAVar3;
  Am_Object local_60;
  undefined1 local_58 [8];
  Am_Object_Method method;
  Am_Object old_object;
  Am_Object ref_object;
  Am_Object local_28;
  Am_Object new_object;
  Am_Choice_How_Set local_18;
  Am_Choice_How_Set how_set;
  Am_Object *inter_local;
  
  how_set.value = (long)inter;
  pAVar2 = Am_Object::Get(inter,0xd4,0);
  Am_Choice_How_Set::Am_Choice_How_Set(&local_18,pAVar2);
  new_object.data = (Am_Object_Data *)Am_CHOICE_LIST_TOGGLE.value;
  bVar1 = Am_Choice_How_Set::operator==(&local_18,Am_CHOICE_LIST_TOGGLE);
  if (bVar1) {
    pAVar2 = Am_Object::Get(inter,0x16a,0);
    Am_Object::Am_Object(&local_28,pAVar2);
    bVar1 = Am_Object::Valid(&local_28);
    if (bVar1) {
      pAVar2 = Am_Object::Get(inter,0x12e,0);
      Am_Object::Am_Object(&old_object,pAVar2);
      pAVar2 = Am_Object::Get(inter,0x1ef,0);
      Am_Object::Am_Object((Am_Object *)&method.Call,pAVar2);
      bVar1 = Am_Object::Valid(&old_object);
      if (!bVar1) {
        Am_Object::operator=(&old_object,&local_28);
        pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&old_object);
        Am_Object::Set(inter,0x12e,pAVar3,1);
      }
      list_set_and_clear(inter,(Am_Object *)&method.Call,&local_28,&old_object);
      pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&local_28);
      Am_Object::Set(inter,0x1ef,pAVar3,0);
      Am_Object::~Am_Object((Am_Object *)&method.Call);
      Am_Object::~Am_Object(&old_object);
    }
    Am_Object::~Am_Object(&local_28);
  }
  else {
    pAVar2 = Am_Object::Get(&Am_Choice_Interactor,200,0);
    Am_Object_Method::Am_Object_Method((Am_Object_Method *)local_58,pAVar2);
    Am_Object::Am_Object(&local_60,inter);
    (*(code *)method.from_wrapper)(&local_60);
    Am_Object::~Am_Object(&local_60);
  }
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, Am_Choice_List_Interim_Do,
                 (Am_Object inter))
{
  Am_Choice_How_Set how_set = inter.Get(Am_HOW_SET);
  if (how_set == Am_CHOICE_LIST_TOGGLE) {
    Am_Object new_object = inter.Get(Am_INTERIM_VALUE);
    if (!new_object.Valid())
      return; //don't do anything if outside

    Am_Object ref_object = inter.Get(Am_INITIAL_REF_OBJECT);
    Am_Object old_object = inter.Get(Am_LAST_USED_OLD_INTERIM_VALUE);

    if (!ref_object.Valid()) {
      ref_object = new_object;
      inter.Set(Am_INITIAL_REF_OBJECT, ref_object, Am_OK_IF_NOT_THERE);
    }
    list_set_and_clear(inter, old_object, new_object, ref_object);
    inter.Set(Am_LAST_USED_OLD_INTERIM_VALUE, new_object);
  } else {
    //use the standard method
    Am_Object_Method method = Am_Choice_Interactor.Get(Am_INTERIM_DO_METHOD);
    method.Call(inter);
  }
}